

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_0::makeChain2(anon_unknown_0 *this,uint i,Promise<void> *promise)

{
  Promise<void> *pPVar1;
  Type *in_RCX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar2;
  Promise<void> PVar3;
  undefined1 local_3c [28];
  Promise<void> *local_20;
  Promise<void> *promise_local;
  anon_unknown_0 *paStack_10;
  uint i_local;
  
  local_20 = promise;
  promise_local._4_4_ = i;
  paStack_10 = this;
  if (i == 0) {
    pPVar1 = mv<kj::Promise<void>>(promise);
    Promise<void>::Promise((Promise<void> *)this,pPVar1);
    pPVar2 = extraout_RDX_00;
  }
  else {
    local_3c._0_4_ = i;
    mvCapture<kj::(anonymous_namespace)::makeChain2(unsigned_int,kj::Promise<void>)::__0,kj::Promise<void>&>
              ((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:265:41),_kj::Promise<void>_>
                *)(local_3c + 4),(kj *)promise,(Promise<void> *)local_3c,in_RCX);
    evalLater<kj::CaptureByMove<kj::(anonymous_namespace)::makeChain2(unsigned_int,kj::Promise<void>)::__0,kj::Promise<void>>>
              ((kj *)this,
               (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:265:41),_kj::Promise<void>_>
                *)(local_3c + 4));
    CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:265:41),_kj::Promise<void>_>
    ::~CaptureByMove((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:265:41),_kj::Promise<void>_>
                      *)(local_3c + 4));
    pPVar2 = extraout_RDX;
  }
  PVar3.super_PromiseBase.node.ptr = pPVar2;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar3.super_PromiseBase.node;
}

Assistant:

Promise<void> makeChain2(uint i, Promise<void> promise) {
  if (i > 0) {
    return evalLater(mvCapture(promise, [i](Promise<void>&& promise) -> Promise<void> {
      return makeChain2(i - 1, kj::mv(promise));
    }));
  } else {
    return kj::mv(promise);
  }
}